

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void MoveToHead(TidyDocImpl *doc,Node *element,Node *node)

{
  Bool BVar1;
  Node *element_00;
  Node *head;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  prvTidyRemoveNode(node);
  BVar1 = prvTidynodeIsElement(node);
  if (BVar1 == no) {
    prvTidyReportError(doc,element,node,0xd0);
    prvTidyFreeNode(doc,node);
  }
  else {
    prvTidyReportError(doc,element,node,0xd3);
    element_00 = prvTidyFindHEAD(doc);
    if (element_00 == (Node *)0x0) {
      __assert_fail("head != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/parser.c"
                    ,0x32e,"void MoveToHead(TidyDocImpl *, Node *, Node *)");
    }
    prvTidyInsertNodeAtEnd(element_00,node);
    if (node->tag->parser != (Parser *)0x0) {
      ParseTag(doc,node,IgnoreWhitespace);
    }
  }
  return;
}

Assistant:

static void MoveToHead( TidyDocImpl* doc, Node *element, Node *node )
{
    Node *head;

    TY_(RemoveNode)( node );  /* make sure that node is isolated */

    if ( TY_(nodeIsElement)(node) )
    {
        TY_(ReportError)(doc, element, node, TAG_NOT_ALLOWED_IN );

        head = TY_(FindHEAD)(doc);
        assert(head != NULL);

        TY_(InsertNodeAtEnd)(head, node);

        if ( node->tag->parser )
            ParseTag( doc, node, IgnoreWhitespace );
    }
    else
    {
        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node );
    }
}